

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O0

sequence_gap_structure *
describe_sequence(char *source,unsigned_long sequence_length,unsigned_long char_count)

{
  char cVar1;
  ulong in_RCX;
  ulong in_RDX;
  long in_RSI;
  sequence_gap_structure *in_RDI;
  sequence_gap_structure *result;
  unsigned_long this_char;
  unsigned_long char_idx;
  long end_run;
  long start_run;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  
  sequence_gap_structure::sequence_gap_structure(in_RDI);
  local_20 = in_RDX + 1;
  local_28 = 0;
  in_RDI->resolved_end = 0;
  in_RDI->resolved_start = local_20;
  for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
    cVar1 = *(char *)(in_RSI + local_30);
    if ((long)cVar1 != 0x11) {
      if (local_30 < (ulong)in_RDI->first_nongap) {
        in_RDI->first_nongap = local_30;
      }
      if ((ulong)in_RDI->last_nongap < local_30) {
        in_RDI->last_nongap = local_30;
      }
    }
    if ((ulong)(long)cVar1 < in_RCX) {
      if (local_30 < local_20) {
        local_20 = local_30;
      }
      local_28 = local_30;
    }
    else {
      if (((long)local_20 <= (long)local_28) &&
         (in_RDI->resolved_end - in_RDI->resolved_start < (long)(local_28 - local_20))) {
        in_RDI->resolved_start = local_20;
        in_RDI->resolved_end = local_28;
      }
      local_20 = in_RDX + 1;
      local_28 = 0;
    }
  }
  if (((long)local_20 <= (long)local_28) &&
     (in_RDI->resolved_end - in_RDI->resolved_start < (long)(local_28 - local_20))) {
    in_RDI->resolved_start = local_20;
    in_RDI->resolved_end = local_28;
  }
  return in_RDI;
}

Assistant:

struct sequence_gap_structure describe_sequence (const char* source, const unsigned long sequence_length, const unsigned long char_count) {
  sequence_gap_structure result;
  
  long start_run = sequence_length + 1UL,
       end_run = 0L;
  
  result.resolved_end = end_run;
  result.resolved_start = start_run;
  
  for (unsigned long char_idx = 0UL; char_idx < sequence_length; char_idx++) {
    unsigned long this_char = source[char_idx];
    if (this_char != GAP) {
      if (char_idx < result.first_nongap) {
        result.first_nongap = char_idx;
      }
      if (char_idx > result.last_nongap) {
        result.last_nongap = char_idx;
      }
      
    }
    if (this_char < char_count) { // not an ambig
      if (char_idx < start_run) {
        end_run = start_run = char_idx;
      } else {
        end_run = char_idx;
      }
    } else { // an ambig
      if (end_run >= start_run) {
        if (end_run - start_run > result.resolved_end - result.resolved_start) {
          result.resolved_start = start_run;
          result.resolved_end = end_run;
        }
      }
      start_run = sequence_length + 1UL;
      end_run = 0L;
    }
  }
  if (end_run >= start_run) {
    if (end_run - start_run > result.resolved_end - result.resolved_start) {
      result.resolved_start = start_run;
      result.resolved_end = end_run;
    }
  }
  
  //cout << sequence_length << "/" << char_count << endl << result.first_nongap << "," 
  //     << result.last_nongap << " : " << result.resolved_start << "," << result.resolved_end << endl;
  
  return result;
}